

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginGroup(void)

{
  ImGuiID IVar1;
  float fVar2;
  ImVec2 local_28;
  ImGuiGroupData *local_20;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window = (ImGuiWindow *)GImGui;
  group_data = (ImGuiGroupData *)GetCurrentWindow();
  ImVector<ImGuiGroupData>::resize
            (&(((ImGuiWindow *)group_data)->DC).GroupStack,
             (((ImGuiWindow *)group_data)->DC).GroupStack.Size + 1);
  local_20 = ImVector<ImGuiGroupData>::back
                       ((ImVector<ImGuiGroupData> *)&group_data[0xb].BackupGroupOffset);
  IVar1 = group_data[4].BackupActiveIdIsAlive;
  (local_20->BackupCursorPos).x = group_data[4].BackupCurrLineTextBaseOffset;
  (local_20->BackupCursorPos).y = (float)IVar1;
  local_20->BackupCursorMaxPos = *(ImVec2 *)&group_data[5].BackupCursorMaxPos.y;
  (local_20->BackupIndent).x = group_data[6].BackupCursorPos.x;
  (local_20->BackupGroupOffset).x = group_data[6].BackupCursorMaxPos.x;
  fVar2 = group_data[5].BackupCurrLineSize.x;
  (local_20->BackupCurrLineSize).x = group_data[5].BackupGroupOffset.x;
  (local_20->BackupCurrLineSize).y = fVar2;
  local_20->BackupCurrLineTextBaseOffset = (float)group_data[5].BackupActiveIdIsAlive;
  local_20->BackupActiveIdIsAlive = (ImGuiID)window[7].ScrollTargetCenterRatio.x;
  local_20->BackupActiveIdPreviousFrameIsAlive =
       (bool)((byte)window[7].SetWindowCollapsedAllowFlags & 1);
  local_20->EmitItem = true;
  group_data[6].BackupCursorMaxPos.x =
       (group_data[4].BackupCurrLineTextBaseOffset - (group_data->BackupIndent).x) -
       group_data[6].BackupCursorPos.y;
  group_data[6].BackupCursorPos.x = group_data[6].BackupCursorMaxPos.x;
  *(undefined8 *)&group_data[5].BackupCursorMaxPos.y =
       *(undefined8 *)&group_data[4].BackupCurrLineTextBaseOffset;
  ImVec2::ImVec2(&local_28,0.0,0.0);
  group_data[5].BackupGroupOffset = (ImVec1)local_28.x;
  group_data[5].BackupCurrLineSize.x = local_28.y;
  if ((window[0xc].LastFrameActive & 1) != 0) {
    window[0xc].ColumnsStorage.Size = -0x800001;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return
}